

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O1

ssize_t __thiscall
vkt::pipeline::TestTexture::write(TestTexture *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  ssize_t sVar6;
  long lVar7;
  undefined4 extraout_var_02;
  ssize_t extraout_RAX;
  int layerNdx;
  ulong uVar8;
  int levelNdx;
  uint uVar9;
  undefined4 in_register_00000034;
  int layerNdx_1;
  int levelNdx_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  ConstPixelBufferAccess srcAccess;
  PixelBufferAccess destAccess;
  uint local_ac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  long local_90;
  TextureFormat local_88;
  IVec3 local_80;
  IVec3 local_74;
  TestTexture *local_60;
  PixelBufferAccess local_58;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  local_90 = CONCAT44(in_register_00000034,__fd);
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_88.order = LA;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_a8,(iterator)0x0,&local_88.order);
  iVar3 = (*this->_vptr_TestTexture[5])(this);
  if ((char)iVar3 == '\0') {
    (*this->_vptr_TestTexture[8])(&local_88,this,0,0);
    local_58.super_ConstPixelBufferAccess.m_format.order =
         tcu::TextureFormat::getPixelSize(&local_88);
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_58);
    }
    else {
      *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_58.super_ConstPixelBufferAccess.m_format.order;
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    dVar4 = 0;
    local_ac = 0;
    local_60 = this;
    while( true ) {
      iVar3 = (*this->_vptr_TestTexture[2])(this);
      sVar6 = CONCAT44(extraout_var_02,iVar3);
      if (iVar3 <= (int)local_ac) break;
      uVar8 = 0;
      while( true ) {
        iVar3 = (*this->_vptr_TestTexture[4])(this);
        if (iVar3 <= (int)uVar8) break;
        dVar4 = getNextMultiple(&local_a8,dVar4);
        (*this->_vptr_TestTexture[8])(&local_88,this,(ulong)local_ac,uVar8);
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_58,&local_88,&local_80,&local_74,(void *)((ulong)dVar4 + local_90));
        tcu::copy((EVP_PKEY_CTX *)&local_58,(EVP_PKEY_CTX *)&local_88);
        iVar2 = local_80.m_data[2];
        iVar1 = local_80.m_data[1];
        iVar3 = local_80.m_data[0];
        iVar5 = tcu::TextureFormat::getPixelSize(&local_88);
        dVar4 = iVar2 * iVar5 * iVar1 * iVar3 + dVar4;
        uVar8 = (ulong)((int)uVar8 + 1);
        this = local_60;
      }
      local_ac = local_ac + 1;
    }
  }
  else {
    iVar3 = (*this->_vptr_TestTexture[10])(this,0,0);
    local_88.order = tcu::getBlockSize(*(CompressedTexFormat *)CONCAT44(extraout_var,iVar3));
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_88.order);
    }
    else {
      *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_88.order;
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar9 = 0;
    dVar4 = 0;
    while( true ) {
      iVar3 = (*this->_vptr_TestTexture[2])(this);
      sVar6 = CONCAT44(extraout_var_00,iVar3);
      if (iVar3 <= (int)uVar9) break;
      uVar8 = 0;
      while( true ) {
        iVar3 = (*this->_vptr_TestTexture[4])(this);
        if (iVar3 <= (int)uVar8) break;
        dVar4 = getNextMultiple(&local_a8,dVar4);
        iVar3 = (*this->_vptr_TestTexture[10])(this,(ulong)uVar9,uVar8);
        lVar7 = CONCAT44(extraout_var_01,iVar3);
        memcpy((void *)((ulong)dVar4 + local_90),*(void **)(lVar7 + 0x10),
               (long)(*(int *)(lVar7 + 0x18) - (int)*(void **)(lVar7 + 0x10)));
        dVar4 = (*(int *)(lVar7 + 0x18) - *(int *)(lVar7 + 0x10)) + dVar4;
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      uVar9 = uVar9 + 1;
    }
  }
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    sVar6 = extraout_RAX;
  }
  return sVar6;
}

Assistant:

void TestTexture::write (deUint8* destPtr) const
{
	std::vector<deUint32>	offsetMultiples;
	deUint32				levelOffset		= 0;

	offsetMultiples.push_back(4);

	if (isCompressed())
	{
		offsetMultiples.push_back(tcu::getBlockSize(getCompressedLevel(0, 0).getFormat()));

		for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
		{
			for (int layerNdx = 0; layerNdx < getArraySize(); layerNdx++)
			{
				levelOffset = getNextMultiple(offsetMultiples, levelOffset);

				const tcu::CompressedTexture&		compressedTex	= getCompressedLevel(levelNdx, layerNdx);

				deMemcpy(destPtr + levelOffset, compressedTex.getData(), compressedTex.getDataSize());
				levelOffset += compressedTex.getDataSize();
			}
		}
	}
	else
	{
		offsetMultiples.push_back(getLevel(0, 0).getFormat().getPixelSize());

		for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
		{
			for (int layerNdx = 0; layerNdx < getArraySize(); layerNdx++)
			{
				levelOffset = getNextMultiple(offsetMultiples, levelOffset);

				const tcu::ConstPixelBufferAccess	srcAccess		= getLevel(levelNdx, layerNdx);
				const tcu::PixelBufferAccess		destAccess		(srcAccess.getFormat(), srcAccess.getSize(), srcAccess.getPitch(), destPtr + levelOffset);

				tcu::copy(destAccess, srcAccess);
				levelOffset += srcAccess.getWidth() * srcAccess.getHeight() * srcAccess.getDepth() * srcAccess.getFormat().getPixelSize();
			}
		}
	}
}